

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelectionModel::emitSelectionChanged
          (QItemSelectionModel *this,QItemSelection *newSelection,QItemSelection *oldSelection)

{
  compare_eq_result_container<QList<QItemSelectionRange>,_QItemSelectionRange> cVar1;
  bool bVar2;
  long i_00;
  int iVar3;
  ulong uVar4;
  int o;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int i;
  long lVar8;
  int iVar9;
  long in_FS_OFFSET;
  QItemSelectionRange local_98;
  QArrayDataPointer<QItemSelectionRange> local_88;
  QArrayDataPointer<QItemSelectionRange> local_68;
  QArrayDataPointer<QItemSelectionRange> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((oldSelection->super_QList<QItemSelectionRange>).d.size != 0) ||
     ((newSelection->super_QList<QItemSelectionRange>).d.size != 0)) {
    cVar1 = QList<QItemSelectionRange>::operator==
                      (&oldSelection->super_QList<QItemSelectionRange>,
                       &newSelection->super_QList<QItemSelectionRange>);
    if (!cVar1) {
      uVar7 = (oldSelection->super_QList<QItemSelectionRange>).d.size;
      if ((uVar7 != 0) &&
         (uVar4 = (newSelection->super_QList<QItemSelectionRange>).d.size, uVar4 != 0)) {
        local_50.d = (oldSelection->super_QList<QItemSelectionRange>).d.d;
        local_50.ptr = (oldSelection->super_QList<QItemSelectionRange>).d.ptr;
        if (local_50.d != (Data *)0x0) {
          LOCK();
          ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          uVar4 = (newSelection->super_QList<QItemSelectionRange>).d.size;
        }
        local_68.d = (newSelection->super_QList<QItemSelectionRange>).d.d;
        local_68.ptr = (newSelection->super_QList<QItemSelectionRange>).d.ptr;
        if (local_68.d != (Data *)0x0) {
          LOCK();
          ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        iVar3 = 0;
        local_68.size = uVar4;
        local_50.size = uVar7;
LAB_004039f5:
        lVar6 = (long)iVar3;
        if (lVar6 < local_50.size) {
          i_00 = 0;
          iVar9 = 1;
          do {
            i_00 = (long)(int)i_00;
            lVar8 = i_00 << 4;
            while( true ) {
              if ((local_68.size <= i_00) || (local_50.size <= lVar6)) {
                iVar3 = iVar3 + iVar9 + 1;
                goto LAB_004039f5;
              }
              bVar2 = ::comparesEqual(local_50.ptr + lVar6,
                                      (QItemSelectionRange *)((long)&((local_68.ptr)->tl).d + lVar8)
                                     );
              if (bVar2) break;
              i_00 = i_00 + 1;
              lVar8 = lVar8 + 0x10;
            }
            QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_50,lVar6);
            iVar9 = 0;
            QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_68,i_00);
          } while( true );
        }
        local_88.size = 0;
        local_88.d = (Data *)0x0;
        local_88.ptr = (QItemSelectionRange *)0x0;
        for (uVar7 = 0; uVar7 < (ulong)local_50.size; uVar7 = uVar7 + 1) {
          lVar6 = 0;
          for (uVar4 = 0; uVar4 < (ulong)local_68.size; uVar4 = uVar4 + 1) {
            bVar2 = QItemSelectionRange::intersects
                              (local_50.ptr + uVar7,
                               (QItemSelectionRange *)((long)&((local_68.ptr)->tl).d + lVar6));
            if (bVar2) {
              QItemSelectionRange::intersected(&local_98,local_50.ptr + uVar7);
              QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                        ((QList<QItemSelectionRange> *)&local_88,&local_98);
              QItemSelectionRange::~QItemSelectionRange(&local_98);
            }
            lVar6 = lVar6 + 0x10;
          }
        }
        uVar7 = 0;
LAB_00403b3a:
        if (uVar7 < (ulong)local_88.size) {
          uVar5 = 0;
          do {
            uVar4 = (ulong)uVar5;
            while( true ) {
              if ((ulong)local_50.size <= uVar4) {
                uVar5 = 0;
                goto LAB_00403ba6;
              }
              bVar2 = QItemSelectionRange::intersects(local_50.ptr + uVar4,local_88.ptr + uVar7);
              if (!bVar2) break;
              QItemSelection::split
                        (local_50.ptr + uVar4,local_88.ptr + uVar7,(QItemSelection *)&local_50);
              QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_50,uVar4);
            }
            uVar5 = uVar5 + 1;
          } while( true );
        }
        if ((local_68.size != 0) || (local_50.size != 0)) {
          selectionChanged(this,(QItemSelection *)&local_68,(QItemSelection *)&local_50);
        }
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_50);
        goto LAB_00403c44;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        selectionChanged(this,newSelection,oldSelection);
        return;
      }
      goto LAB_00403cd8;
    }
  }
LAB_00403c44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00403cd8:
  __stack_chk_fail();
LAB_00403ba6:
  uVar4 = (ulong)uVar5;
  while( true ) {
    if ((ulong)local_68.size <= uVar4) {
      uVar7 = uVar7 + 1;
      goto LAB_00403b3a;
    }
    bVar2 = QItemSelectionRange::intersects(local_68.ptr + uVar4,local_88.ptr + uVar7);
    if (!bVar2) break;
    QItemSelection::split(local_68.ptr + uVar4,local_88.ptr + uVar7,(QItemSelection *)&local_68);
    QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_68,uVar4);
  }
  uVar5 = uVar5 + 1;
  goto LAB_00403ba6;
}

Assistant:

void QItemSelectionModel::emitSelectionChanged(const QItemSelection &newSelection,
                                               const QItemSelection &oldSelection)
{
    // if both selections are empty or equal we return
    if ((oldSelection.isEmpty() && newSelection.isEmpty()) ||
        oldSelection == newSelection)
        return;

    // if either selection is empty we do not need to compare
    if (oldSelection.isEmpty() || newSelection.isEmpty()) {
        emit selectionChanged(newSelection, oldSelection);
        return;
    }

    QItemSelection deselected = oldSelection;
    QItemSelection selected = newSelection;

    // remove equal ranges
    bool advance;
    for (int o = 0; o < deselected.size(); ++o) {
        advance = true;
        for (int s = 0; s < selected.size() && o < deselected.size();) {
            if (deselected.at(o) == selected.at(s)) {
                deselected.removeAt(o);
                selected.removeAt(s);
                advance = false;
            } else {
                ++s;
            }
        }
        if (advance)
            ++o;
    }

    // find intersections
    QItemSelection intersections;
    for (int o = 0; o < deselected.size(); ++o) {
        for (int s = 0; s < selected.size(); ++s) {
            if (deselected.at(o).intersects(selected.at(s)))
                intersections.append(deselected.at(o).intersected(selected.at(s)));
        }
    }

    // compare remaining ranges with intersections and split them to find deselected and selected
    for (int i = 0; i < intersections.size(); ++i) {
        // split deselected
        for (int o = 0; o < deselected.size();) {
            if (deselected.at(o).intersects(intersections.at(i))) {
                QItemSelection::split(deselected.at(o), intersections.at(i), &deselected);
                deselected.removeAt(o);
            } else {
                ++o;
            }
        }
        // split selected
        for (int s = 0; s < selected.size();) {
            if (selected.at(s).intersects(intersections.at(i))) {
                QItemSelection::split(selected.at(s), intersections.at(i), &selected);
                selected.removeAt(s);
            } else {
                ++s;
            }
        }
    }

    if (!selected.isEmpty() || !deselected.isEmpty())
        emit selectionChanged(selected, deselected);
}